

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O1

bool __thiscall
libtorrent::aux::peer_connection::can_disconnect(peer_connection *this,error_code *ec)

{
  char cVar1;
  list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
  *plVar2;
  _List_node_base *p_Var3;
  
  plVar2 = &this->m_extensions;
  p_Var3 = (_List_node_base *)plVar2;
  do {
    p_Var3 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)plVar2) break;
    cVar1 = (**(code **)(*(long *)p_Var3[1]._M_next + 0x128))(p_Var3[1]._M_next,ec);
  } while (cVar1 != '\0');
  return p_Var3 == (_List_node_base *)plVar2;
}

Assistant:

bool peer_connection::can_disconnect(error_code const& ec) const
	{
		TORRENT_ASSERT(is_single_thread());
#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			if (!e->can_disconnect(ec)) return false;
		}
#else
		TORRENT_UNUSED(ec);
#endif
		return true;
	}